

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  in_addr prefix;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this;
  byte bVar1;
  uchar prefix_len;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  undefined1 *puVar8;
  reference this_00;
  reference pvVar9;
  reference pbVar10;
  bgp_client_peer *peer_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<bgp_client_peer,_std::allocator<bgp_client_peer>_> *__range1_1;
  bgp_client_peer *peer_1;
  iterator __end1;
  iterator __begin1;
  vector<bgp_client_peer,_std::allocator<bgp_client_peer>_> *__range1;
  duration<long,_std::ratio<1L,_1000000L>_> local_780;
  uint64_t local_778;
  int local_76c;
  command_result_status local_768;
  int i_3;
  command_result_status command_result;
  undefined1 local_73c [8];
  attributes a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  in_addr local_5e4;
  reference pbStack_5e0;
  in_addr address;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *network;
  iterator __end13;
  iterator __begin13;
  key_type local_590;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_570;
  value_type *__range13;
  type tStack_560;
  int i_2;
  duration<long,_std::ratio<1L,_1L>_> local_558;
  rep local_550;
  uint64_t local_548;
  int local_540;
  char local_539;
  int i_1;
  char input;
  byte local_529;
  int iStack_528;
  bool is_input_continuous;
  uint64_t real_time;
  time_point now;
  time_point start;
  node<adj_ribs_in_data> *root;
  key_type local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  allocator<char> local_4b9;
  key_type local_4b8;
  undefined1 local_498 [8];
  bgp_client_peer peer;
  key_type local_450;
  undefined1 local_430 [8];
  value_type neighbor;
  key_type local_418;
  int local_3f8;
  uint32_t local_3f4;
  int i;
  allocator<char> local_3e1;
  key_type local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator<char> local_399;
  key_type local_398;
  exception *e;
  json conf_json;
  istream local_350 [8];
  ifstream conf_file;
  undefined1 local_148 [8];
  sigaction old_act;
  sigaction act;
  time_point up;
  
  act.sa_restorer = (_func_void *)std::chrono::_V2::system_clock::now();
  old_act.sa_restorer = signal_handler;
  sigemptyset((sigset_t *)&act);
  act.sa_mask.__val[0xf]._0_4_ = 0x20000000;
  iVar3 = sigaction(0xe,(sigaction *)&old_act.sa_restorer,(sigaction *)local_148);
  if (iVar3 < 0) {
    fprintf(_stderr,"Error registering signal disposition\n");
    exit(1);
  }
  log_id = '\0';
  log<>(INFO,"Hello BGP!!");
  fcntl(0,4,0x800);
  std::ifstream::ifstream(local_350,"../config.json",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    log<>(ERROR,"Failed to open config");
    exit(1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&e,(nullptr_t)0x0);
  nlohmann::operator>>
            (local_350,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)&e);
  std::ifstream::close();
  log<>(INFO,"Succeed to load config");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"my_as",&local_399);
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&e,&local_398);
  my_as = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::get<int,int>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar4);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  log<unsigned_int>(INFO,"My AS: %d",&my_as);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"router-id",&local_3e1);
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&e,&local_3e0);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::get<std::__cxx11::string,std::__cxx11::string>
            (&local_3c0,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)pvVar4);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  router_id = inet_addr(pcVar5);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  local_3f4 = router_id;
  _i = inet_ntoa((in_addr)router_id);
  log<char*>(INFO,"Router-ID: %s",(char **)&i);
  bgp_loc_rib = (node<loc_rib_data> *)malloc(0x30);
  if (bgp_loc_rib == (node<loc_rib_data> *)0x0) {
    log<>(ERROR,"Failed to allocate memory for loc_rib root");
    exit(1);
  }
  bgp_loc_rib->is_prefix = false;
  bgp_loc_rib->prefix = 0;
  bgp_loc_rib->prefix_len = '\0';
  bgp_loc_rib->data = (loc_rib_data *)0x0;
  bgp_loc_rib->parent = (node<loc_rib_data> *)0x0;
  bgp_loc_rib->node_0 = (node<loc_rib_data> *)0x0;
  bgp_loc_rib->node_1 = (node<loc_rib_data> *)0x0;
  local_3f8 = 0;
  while( true ) {
    uVar6 = (ulong)local_3f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"neighbors",(allocator<char> *)((long)&neighbor.m_value + 7));
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&e,&local_418);
    sVar7 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::size(pvVar4);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)((long)&neighbor.m_value + 7));
    if (sVar7 <= uVar6) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"neighbors",(allocator<char> *)&peer.field_0x3f);
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&e,&local_450);
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](pvVar4,(long)local_3f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_430,pvVar4);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator((allocator<char> *)&peer.field_0x3f);
    bgp_client_peer::bgp_client_peer((bgp_client_peer *)local_498);
    peer.super_bgp_peer._vptr_bgp_peer._0_1_ = (undefined1)local_3f8;
    peer.super_bgp_peer.bgp_id = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"remote-as",&local_4b9);
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_430,&local_4b8);
    peer.server_address.sin_zero._0_4_ =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator_unsigned_int<unsigned_int,_0>(pvVar4);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    peer.super_bgp_peer._vptr_bgp_peer._1_1_ = 2;
    peer.super_bgp_peer.route_count._0_2_ = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"address",(allocator<char> *)((long)&root + 7));
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_430,&local_500);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::get<std::__cxx11::string,std::__cxx11::string>
              (&local_4e0,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)pvVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = inet_aton(pcVar5,(in_addr *)&peer.sock);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)((long)&root + 7));
    if (iVar3 == 0) {
      log<>(ERROR,"Invalid IP address in config");
      exit(1);
    }
    peer.super_bgp_peer._vptr_bgp_peer._1_1_ = 0;
    puVar8 = (undefined1 *)malloc(0x30);
    if (puVar8 == (undefined1 *)0x0) {
      log<>(ERROR,"Failed to allocate memory for adj_ribs_in root");
      exit(1);
    }
    *puVar8 = 0;
    *(undefined8 *)(puVar8 + 0x18) = 0;
    *(undefined8 *)(puVar8 + 0x20) = 0;
    *(undefined8 *)(puVar8 + 0x28) = 0;
    peer.server_address.sin_zero[4] = '\0';
    peer.server_address.sin_zero[5] = '\0';
    peer.server_address.sin_zero[6] = '\0';
    peer.server_address.sin_zero[7] = '\0';
    peer.super_bgp_peer._8_8_ = puVar8;
    std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::push_back
              (&peers,(value_type *)local_498);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_430);
    local_3f8 = local_3f8 + 1;
  }
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&now);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&real_time);
  local_529 = 0;
  do {
    _i_1 = std::chrono::_V2::system_clock::now();
    now.__d.__r = (duration)(duration)_i_1;
    iVar3 = getchar();
    local_539 = (char)iVar3;
    if (console_mode == '\0') {
      if (local_539 == -1) {
        local_529 = 0;
      }
      else {
        if ((local_529 & 1) == 0) {
          if (local_539 == 'q') {
            log<>(INFO,"Good bye");
LAB_00105bea:
            __end1 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::begin(&peers);
            peer_1 = (bgp_client_peer *)
                     std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::end(&peers);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end1,(__normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
                                               *)&peer_1), bVar2) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
                        ::operator*(&__end1);
              close_client_peer(pbVar10);
              __gnu_cxx::
              __normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
              ::operator++(&__end1);
            }
            log<>(INFO,"Closed all peers");
            __end1_1 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::begin(&peers)
            ;
            peer_2 = (bgp_client_peer *)
                     std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::end(&peers);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end1_1,
                                      (__normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
                                       *)&peer_2), bVar2) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
                        ::operator*(&__end1_1);
              free((pbVar10->super_bgp_peer).adj_ribs_in);
              __gnu_cxx::
              __normal_iterator<bgp_client_peer_*,_std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>_>
              ::operator++(&__end1_1);
            }
            delete_prefix<loc_rib_data>(bgp_loc_rib,false);
            printf("Safety exited\n");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&e);
            std::ifstream::~ifstream(local_350);
            return 0;
          }
          if (local_539 == 'b') {
            raise(2);
          }
          else if (local_539 == 'c') {
            console_mode = '\x01';
            for (local_540 = 0; local_540 < 1000; local_540 = local_540 + 1) {
              getchar();
            }
            printf("Switched to command mode\n");
            printf("> ");
          }
        }
        local_529 = 1;
      }
    }
    else {
      if ((main::cmd_str_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&main::cmd_str_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::string::string((string *)&main::cmd_str_abi_cxx11_);
        __cxa_atexit(std::__cxx11::string::~string,&main::cmd_str_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&main::cmd_str_abi_cxx11_);
      }
      if (local_539 != -1) {
        if ((local_539 < ' ') || ('~' < local_539)) {
          if (local_539 == '\n') {
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              bVar2 = std::operator==(&main::cmd_str_abi_cxx11_,"exit");
              if (bVar2) {
                console_mode = '\0';
                printf("Switched to log mode\n");
              }
              else {
                bVar2 = std::operator==(&main::cmd_str_abi_cxx11_,"break");
                if (bVar2) {
                  raise(2);
                }
                else {
                  bVar2 = std::operator==(&main::cmd_str_abi_cxx11_,"uptime");
                  if (bVar2) {
                    local_548 = std::chrono::_V2::system_clock::now();
                    real_time = local_548;
                    tStack_560 = std::chrono::operator-
                                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                             *)&real_time,
                                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                             *)&act.sa_restorer);
                    local_558.__r =
                         (rep)std::chrono::
                              duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                        (&stack0xfffffffffffffaa0);
                    local_550 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_558);
                    console<long>("Uptime %d seconds",&local_550);
                  }
                  else {
                    bVar2 = std::operator==(&main::cmd_str_abi_cxx11_,"shutdown");
                    if (bVar2) {
                      console<>("Good bye");
                      goto LAB_00105bea;
                    }
                    bVar2 = std::operator==(&main::cmd_str_abi_cxx11_,"test");
                    if (bVar2) {
                      for (__range13._4_4_ = 0; uVar6 = (ulong)__range13._4_4_,
                          sVar7 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::
                                  size(&peers), uVar6 < sVar7; __range13._4_4_ = __range13._4_4_ + 1
                          ) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_590,"networks",
                                   (allocator<char> *)
                                   ((long)&__begin13.m_it.primitive_iterator.m_it + 7));
                        pvVar4 = nlohmann::
                                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&e,&local_590);
                        std::__cxx11::string::~string((string *)&local_590);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)
                                   ((long)&__begin13.m_it.primitive_iterator.m_it + 7));
                        local_570 = pvVar4;
                        nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::begin((iterator *)&__end13.m_it.primitive_iterator,pvVar4);
                        nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::end((iterator *)&network,local_570);
                        while (bVar2 = nlohmann::detail::
                                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ::
                                       operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                                 ((
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)&__end13.m_it.primitive_iterator,
                                                  (
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)&network), bVar2) {
                          this_00 = nlohmann::detail::
                                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 *)&__end13.m_it.primitive_iterator);
                          local_5e4.s_addr = 0;
                          pbStack_5e0 = this_00;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&a.local_pref,"prefix",
                                     (allocator<char> *)((long)&a.med + 3));
                          pvVar4 = nlohmann::
                                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   ::at(this_00,(key_type *)&a.local_pref);
                          nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::get<std::__cxx11::string,std::__cxx11::string>
                                    (&local_608,
                                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      *)pvVar4);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          iVar3 = inet_aton(pcVar5,&local_5e4);
                          std::__cxx11::string::~string((string *)&local_608);
                          std::__cxx11::string::~string((string *)&a.local_pref);
                          std::allocator<char>::~allocator((allocator<char> *)((long)&a.med + 3));
                          if (iVar3 == 0) {
                            log<>(ERROR,"Invalid IP address in config");
                            exit(1);
                          }
                          attributes::attributes((attributes *)local_73c);
                          local_73c[0] = '\0';
                          local_73c[1] = '\0';
                          a.as_path[0x3e] = inet_addr("172.16.3.0");
                          a.as_path[0x3f] = 100;
                          a.next_hop = 0;
                          pvVar9 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::
                                   operator[](&peers,(long)__range13._4_4_);
                          this = pbStack_5e0;
                          prefix.s_addr = local_5e4.s_addr;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&command_result,"prefix-length",
                                     (allocator<char> *)((long)&i_3 + 3));
                          pvVar4 = nlohmann::
                                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   ::at(this,(key_type *)&command_result);
                          prefix_len = nlohmann::
                                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       ::operator_unsigned_char<unsigned_char,_0>(pvVar4);
                          send_update_with_nlri
                                    (&pvVar9->super_bgp_peer,(attributes *)local_73c,prefix.s_addr,
                                     prefix_len);
                          std::__cxx11::string::~string((string *)&command_result);
                          std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 3));
                          nlohmann::detail::
                          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&__end13.m_it.primitive_iterator);
                        }
                      }
                    }
                    else {
                      local_768 = execute_command(&main::cmd_str_abi_cxx11_);
                      if (local_768 == NOT_FOUND) {
                        console<>("Command not found");
                      }
                      else if (local_768 == INVALID_PARAMS) {
                        console<>("Invalid parameters");
                      }
                    }
                  }
                }
              }
            }
            std::__cxx11::string::clear();
            if (console_mode == '\x01') {
              printf("> ");
            }
          }
        }
        else {
          std::__cxx11::string::push_back('H');
        }
      }
    }
    for (local_76c = 0; uVar6 = (ulong)local_76c,
        sVar7 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::size(&peers),
        uVar6 < sVar7; local_76c = local_76c + 1) {
      log_id = (uint8_t)local_76c;
      pvVar9 = std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::operator[]
                         (&peers,(long)local_76c);
      bgp_client_loop(pvVar9);
    }
    log_id = 0xff;
    local_778 = std::chrono::_V2::system_clock::now();
    real_time = local_778;
    __range1 = (vector<bgp_client_peer,_std::allocator<bgp_client_peer>_> *)
               std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&real_time,&now);
    local_780.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&__range1);
    _iStack_528 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_780);
    if (_iStack_528 < 100) {
      usleep(100 - iStack_528);
    }
  } while( true );
}

Assistant:

int main(){
    std::chrono::system_clock::time_point up = std::chrono::system_clock::now();

    struct sigaction act, old_act;

    act.sa_handler = signal_handler;
    sigemptyset(&act.sa_mask);
    act.sa_flags = 0;
    act.sa_flags |= SA_INTERRUPT;

    if(sigaction(SIGALRM, &act, &old_act) < 0){
        fprintf(stderr, "Error registering signal disposition\n");
        exit(EXIT_FAILURE);
    }
    log_id = 0;
    log(log_level::INFO, "Hello BGP!!");
    fcntl(0, F_SETFL, O_NONBLOCK);

    std::ifstream conf_file(CONFIG_PATH, std::ios::in);
    if(!conf_file.is_open()){
        log(log_level::ERROR, "Failed to open config");
        exit(EXIT_FAILURE);
    }
    nlohmann::json conf_json;

    try{
        conf_file >> conf_json;
    }catch(nlohmann::detail::exception &e){
        log(log_level::ERROR, "Failed to load config");
        exit(EXIT_FAILURE);
    }
    conf_file.close();

    log(log_level::INFO, "Succeed to load config");

    my_as = conf_json.at("my_as").get<int>();
    log(log_level::INFO, "My AS: %d", my_as);

    router_id = inet_addr(conf_json.at("router-id").get<std::string>().c_str());
    log(log_level::INFO, "Router-ID: %s", inet_ntoa(in_addr{.s_addr = router_id}));

    bgp_loc_rib = (node<loc_rib_data>*) malloc(sizeof(node<loc_rib_data>));
    if(bgp_loc_rib == nullptr){
        log(log_level::ERROR, "Failed to allocate memory for loc_rib root");
        exit(EXIT_FAILURE);
    }
    bgp_loc_rib->is_prefix = false;
    bgp_loc_rib->prefix = 0;
    bgp_loc_rib->prefix_len = 0;
    bgp_loc_rib->data = nullptr;
    bgp_loc_rib->parent = nullptr;
    bgp_loc_rib->node_0 = nullptr;
    bgp_loc_rib->node_1 = nullptr;

    for(int i=0;i<conf_json.at("neighbors").size();i++){
        auto neighbor = conf_json.at("neighbors")[i];
        bgp_client_peer peer;
        peer.index = i;
        peer.sock = 0;
        peer.remote_as = neighbor.at("remote-as");
        peer.state = ACTIVE;
        peer.server_address.sin_family = AF_INET;

        if(inet_aton(neighbor.at("address").get<std::string>().c_str(), &peer.server_address.sin_addr) == 0){
            log(log_level::ERROR, "Invalid IP address in config");
            exit(EXIT_FAILURE);
        }
        peer.state = IDLE;

        auto* root = (node<adj_ribs_in_data>*) malloc(sizeof(node<adj_ribs_in_data>));
        if(root == nullptr){
            log(log_level::ERROR, "Failed to allocate memory for adj_ribs_in root");
            exit(EXIT_FAILURE);
        }
        root->is_prefix = false;
        root->parent = nullptr;
        root->node_0 = nullptr;
        root->node_1 = nullptr;
        peer.adj_ribs_in = root;
        peer.connect_cool_loop_time = 0;
        peers.push_back(peer); // これ、よく見るとブロック抜けたらpeerのメモリ解放されそうだけど、今のところこれで問題が起きたことがないのはなぜだろう
    }

    std::chrono::system_clock::time_point start, now;
    uint64_t real_time;
    bool is_input_continuous = false; // ログモードの時に長いテキストを間違えてペーストしてその中にcやbが含まれていると止まってしまうので、連続で入力された場合は無視するために前回のループで入力があったかを保持する
    while(true){
        start = std::chrono::system_clock::now();
        char input = getchar(); // TODO charの範囲外かもしれない
        if(console_mode == 0){
            if(input == -1){
                is_input_continuous = false;
            }else{
                if(!is_input_continuous){
                    if(input == 'q'){ // TODO ログモードからのプログラム終了は廃止したい
                        log(log_level::INFO, "Good bye");
                        break;
                    }else if(input == 'b'){
                        raise(SIGINT);
                    }else if(input == 'c'){
                        console_mode = 1;
                        for(int i = 0; i < 1000; ++i){
                            getchar(); // 連続入力の対策はしているが、もしかすると連続する文字列がcから始まるかもしれない. その場合、対策をすり抜けてしまうのでへんなコマンドが実行されないようにここでバッファをクリアする
                        }
                        printf("Switched to command mode\n");
                        printf("> ");
                    }
                }
                is_input_continuous = true;
            }
        }else{
            static std::string cmd_str;
            if(input != -1){
                if(input >= 0x20 and input <= 0x7e){
                    cmd_str.push_back(input);
                }else if(input == 0x0a){
                    if(cmd_str.empty()){
                    }else if(cmd_str == "exit"){
                        console_mode = 0;
                        printf("Switched to log mode\n");
                    }else if(cmd_str == "break"){
                        raise(SIGINT);
                    }else if(cmd_str == "uptime"){
                        now = std::chrono::system_clock::now();
                        console("Uptime %d seconds", std::chrono::duration_cast<std::chrono::seconds>(now-up).count());
                    }else if(cmd_str == "shutdown"){
                        console("Good bye");
                        break;
                    }else if(cmd_str == "test"){
                        for(int i = 0; i < peers.size(); ++i){
                            for(auto &network: conf_json.at("networks")){
                                in_addr address = {};
                                if(inet_aton(network.at("prefix").get<std::string>().c_str(), &address) == 0){
                                    log(log_level::ERROR, "Invalid IP address in config");
                                    exit(EXIT_FAILURE);
                                }
                                attributes a;
                                a.origin = IGP;
                                a.as_path_length = 0;
                                a.next_hop = inet_addr("172.16.3.0");
                                a.med = 100;
                                a.local_pref = 0;
                                send_update_with_nlri(&peers[i], &a, address.s_addr, network.at("prefix-length"));
                            }
                        }
                    }else{
                        command_result_status command_result = execute_command(cmd_str);
                        if(command_result == command_result_status::NOT_FOUND){
                            console("Command not found");
                        }else if(command_result == command_result_status::INVALID_PARAMS){
                            console("Invalid parameters");
                        }
                    }
                    cmd_str.clear();
                    if(console_mode == 1){ // Exitされていないなら
                        printf("> ");
                    }
                }
            }
        }

        for(int i = 0; i < peers.size(); ++i){
            log_id = i;
            if(!bgp_client_loop(&peers[i])){
            }
        }
        log_id = 0xff;

        now = std::chrono::system_clock::now();
        real_time = std::chrono::duration_cast<std::chrono::microseconds>(now-start).count();
        if(LOOP_MINIMUM_US > real_time){ // もしこのループにかかった時間がLOOP_MINIMUM_US未満なら
            usleep(LOOP_MINIMUM_US - real_time); //　LOOP_MINIMUM_USに満たない時間分ループが終わるのを待つ
        }
    }

    for(auto & peer : peers){
        close_client_peer(&peer);
    }
    log(log_level::INFO, "Closed all peers");

    for(auto & peer : peers){
        free(peer.adj_ribs_in); // root自体はまだ解放されていないのでここで
    }
    delete_prefix(bgp_loc_rib);
    printf("Safety exited\n");
    return EXIT_SUCCESS;
}